

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

void mpc_input_mark(mpc_input_t *i)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  mpc_state_t *pmVar6;
  char *pcVar7;
  int iVar8;
  
  if (0 < i->backtrack) {
    iVar2 = i->marks_num;
    iVar8 = iVar2 + 1;
    i->marks_num = iVar8;
    if (i->marks_slots <= iVar2) {
      iVar8 = iVar8 / 2 + iVar8;
      i->marks_slots = iVar8;
      pmVar6 = (mpc_state_t *)realloc(i->marks,(long)iVar8 << 5);
      i->marks = pmVar6;
      pcVar7 = (char *)realloc(i->lasts,(long)i->marks_slots);
      i->lasts = pcVar7;
      iVar8 = i->marks_num;
    }
    pmVar6 = i->marks;
    lVar3 = (i->state).pos;
    lVar4 = (i->state).row;
    uVar5 = *(undefined8 *)&(i->state).term;
    plVar1 = &pmVar6[(long)iVar8 + -1].col;
    *plVar1 = (i->state).col;
    plVar1[1] = uVar5;
    pmVar6 = pmVar6 + (long)iVar8 + -1;
    pmVar6->pos = lVar3;
    pmVar6->row = lVar4;
    i->lasts[(long)i->marks_num + -1] = i->last;
    if ((i->type == 2) && (i->marks_num == 1)) {
      pcVar7 = (char *)calloc(1,1);
      i->buffer = pcVar7;
    }
  }
  return;
}

Assistant:

static void mpc_input_mark(mpc_input_t *i) {

  if (i->backtrack < 1) { return; }

  i->marks_num++;

  if (i->marks_num > i->marks_slots) {
    i->marks_slots = i->marks_num + i->marks_num / 2;
    i->marks = realloc(i->marks, sizeof(mpc_state_t) * i->marks_slots);
    i->lasts = realloc(i->lasts, sizeof(char) * i->marks_slots);
  }

  i->marks[i->marks_num-1] = i->state;
  i->lasts[i->marks_num-1] = i->last;

  if (i->type == MPC_INPUT_PIPE && i->marks_num == 1) {
    i->buffer = calloc(1, 1);
  }

}